

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O3

int ndn_signature_info_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  byte bVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  uint64_t *value;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint32_t local_34;
  
  signature->enable_KeyLocator = '\0';
  signature->enable_ValidityPeriod = '\0';
  signature->is_interest = false;
  signature->enable_SignatureNonce = '\0';
  signature->signature_nonce = 0;
  signature->enable_Timestamp = '\0';
  signature->timestamp = 0;
  signature->enable_Seqnum = '\0';
  signature->seqnum = 0;
  puVar2 = decoder->input_value;
  uVar8 = decoder->offset;
  bVar1 = puVar2[uVar8];
  uVar7 = (uint)bVar1;
  uVar6 = decoder->input_size;
  if (bVar1 < 0xfd) {
    iVar5 = 1;
  }
  else if (uVar6 - uVar8 < 3 || bVar1 != 0xfd) {
    if (uVar6 - uVar8 < 5 || bVar1 != 0xfe) {
      return -0xe;
    }
    uVar7 = (uint)puVar2[uVar8 + 4] |
            (uint)puVar2[uVar8 + 3] << 8 |
            (uint)puVar2[uVar8 + 2] << 0x10 | (uint)puVar2[uVar8 + 1] << 0x18;
    iVar5 = 5;
  }
  else {
    uVar7 = (uint)CONCAT11(puVar2[uVar8 + 1],puVar2[uVar8 + 2]);
    iVar5 = 3;
  }
  uVar8 = iVar5 + uVar8;
  decoder->offset = uVar8;
  if (uVar7 == 0x16) {
    _Var4 = false;
  }
  else {
    if (uVar7 != 0x2c) {
      return -0xc;
    }
    _Var4 = true;
  }
  signature->is_interest = _Var4;
  bVar1 = puVar2[uVar8];
  uVar7 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar5 = 1;
  }
  else if (uVar6 - uVar8 < 3 || bVar1 != 0xfd) {
    if (uVar6 - uVar8 < 5 || uVar7 != 0xfe) {
      return -0xe;
    }
    uVar7 = (uint)puVar2[uVar8 + 4] |
            (uint)puVar2[uVar8 + 3] << 8 |
            (uint)puVar2[uVar8 + 2] << 0x10 | (uint)puVar2[uVar8 + 1] << 0x18;
    iVar5 = 5;
  }
  else {
    uVar7 = (uint)CONCAT11(puVar2[uVar8 + 1],puVar2[uVar8 + 2]);
    iVar5 = 3;
  }
  uVar8 = iVar5 + uVar8;
  decoder->offset = uVar8;
  bVar1 = puVar2[uVar8];
  iVar5 = 1;
  iVar9 = 1;
  if (((0xfc < bVar1) && (iVar9 = 3, bVar1 != 0xfd || uVar6 - uVar8 < 3)) &&
     (iVar9 = 5, uVar6 - uVar8 < 5 || bVar1 != 0xfe)) {
    return -0xe;
  }
  uVar10 = iVar9 + uVar8;
  decoder->offset = uVar10;
  bVar1 = puVar2[uVar10];
  if (((0xfc < bVar1) && (iVar5 = 3, bVar1 != 0xfd || uVar6 - uVar10 < 3)) &&
     (iVar5 = 5, uVar6 - uVar10 < 5 || bVar1 != 0xfe)) {
    return -0xe;
  }
  decoder->offset = iVar5 + uVar10;
  if (uVar6 < iVar5 + uVar10 + 1) {
LAB_0010f4a0:
    iVar5 = -10;
  }
  else {
    signature->sig_type = puVar2[iVar5 + uVar10];
    uVar6 = decoder->offset + 1;
    decoder->offset = uVar6;
    if (uVar6 < uVar8 + uVar7) {
      do {
        puVar2 = decoder->input_value;
        bVar1 = puVar2[uVar6];
        local_34 = (uint32_t)bVar1;
        if (bVar1 < 0xfd) {
          iVar5 = 1;
        }
        else {
          uVar10 = decoder->input_size - uVar6;
          if ((bVar1 == 0xfd) && (2 < uVar10)) {
            local_34 = (uint32_t)CONCAT11(puVar2[(ulong)uVar6 + 1],puVar2[uVar6 + 2]);
            iVar5 = 3;
          }
          else {
            if (local_34 != 0xfe) {
              return -0xe;
            }
            if (uVar10 < 5) {
              return -0xe;
            }
            local_34 = (uint)puVar2[uVar6 + 4] |
                       (uint)puVar2[uVar6 + 3] << 8 |
                       (uint)puVar2[uVar6 + 2] << 0x10 | (uint)puVar2[(ulong)uVar6 + 1] << 0x18;
            iVar5 = 5;
          }
        }
        decoder->offset = iVar5 + uVar6;
        if ((int)local_34 < 0x28) {
          if (local_34 == 10) {
            signature->enable_SignatureNonce = '\x01';
            iVar5 = decoder_get_length(decoder,&local_34);
            if (iVar5 != 0) {
              return iVar5;
            }
            if (local_34 != 4) {
              return -0xd;
            }
            iVar5 = decoder_get_uint32_value(decoder,&signature->signature_nonce);
          }
          else {
            if (local_34 != 0x1c) {
              return -0xc;
            }
            signature->enable_KeyLocator = '\x01';
            iVar5 = decoder_get_length(decoder,&local_34);
            if (iVar5 != 0) {
              return iVar5;
            }
            iVar5 = ndn_name_tlv_decode(decoder,&signature->key_locator_name);
          }
LAB_0010f733:
          if (iVar5 != 0) {
            return iVar5;
          }
        }
        else {
          if (local_34 == 0x28) {
            signature->enable_Timestamp = '\x01';
            iVar5 = decoder_get_length(decoder,&local_34);
            value = &signature->timestamp;
joined_r0x0010f722:
            if (iVar5 != 0) {
              return iVar5;
            }
            iVar5 = decoder_get_uint_value(decoder,local_34,value);
            goto LAB_0010f733;
          }
          if (local_34 == 0x2a) {
            signature->enable_Seqnum = '\x01';
            iVar5 = decoder_get_length(decoder,&local_34);
            value = &signature->seqnum;
            goto joined_r0x0010f722;
          }
          if (local_34 != 0xfd) {
            return -0xc;
          }
          signature->enable_ValidityPeriod = '\x01';
          iVar5 = decoder_get_length(decoder,&local_34);
          if (iVar5 != 0) {
            return iVar5;
          }
          iVar5 = decoder_get_type(decoder,&local_34);
          if (iVar5 != 0) {
            return iVar5;
          }
          iVar5 = decoder_get_length(decoder,&local_34);
          if (iVar5 != 0) {
            return iVar5;
          }
          uVar6 = decoder->offset;
          if ((int)(decoder->input_size - uVar6) < 0xf) goto LAB_0010f4a0;
          uVar3 = *(undefined8 *)(decoder->input_value + uVar6);
          *(undefined8 *)((signature->validity_period).not_before + 7) =
               *(undefined8 *)(decoder->input_value + (ulong)uVar6 + 7);
          *(undefined8 *)(signature->validity_period).not_before = uVar3;
          decoder->offset = decoder->offset + 0xf;
          iVar5 = decoder_get_type(decoder,&local_34);
          if (iVar5 != 0) {
            return iVar5;
          }
          iVar5 = decoder_get_length(decoder,&local_34);
          if (iVar5 != 0) {
            return iVar5;
          }
          uVar6 = decoder->offset;
          if ((int)(decoder->input_size - uVar6) < 0xf) goto LAB_0010f4a0;
          uVar3 = *(undefined8 *)(decoder->input_value + uVar6);
          *(undefined8 *)((signature->validity_period).not_after + 7) =
               *(undefined8 *)(decoder->input_value + (ulong)uVar6 + 7);
          *(undefined8 *)(signature->validity_period).not_after = uVar3;
          decoder->offset = decoder->offset + 0xf;
        }
        uVar6 = decoder->offset;
      } while (uVar6 < uVar8 + uVar7);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
ndn_signature_info_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  ndn_signature_init(signature, false);

  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureInfo) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureInfo) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t value_length = 0;
  ret_val = decoder_get_length(decoder, &value_length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t value_starting = decoder->offset;

  // signature type
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_length(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_byte_value(decoder, &signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  while (decoder->offset < value_starting + value_length) {
    ret_val = decoder_get_type(decoder, &probe);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (probe == TLV_KeyLocator) {
      signature->enable_KeyLocator = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = ndn_name_tlv_decode(decoder, &signature->key_locator_name);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_ValidityPeriod) {
      signature->enable_ValidityPeriod = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_before, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_after, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Nonce) {
      signature->enable_SignatureNonce = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      if (probe != 4) {
        return NDN_WRONG_TLV_LENGTH;
      }
      ret_val = decoder_get_uint32_value(decoder, &signature->signature_nonce);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Timestamp) {
      signature->enable_Timestamp = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->timestamp);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_SeqNum) {
      signature->enable_Seqnum = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->seqnum);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else
      return NDN_WRONG_TLV_TYPE;
  }
  return 0;
}